

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

OrphanBuilder *
capnp::_::OrphanBuilder::concat
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementSize elementSize,StructSize structSize,ArrayPtr<const_capnp::_::ListReader> lists)

{
  ListReader *pLVar1;
  ushort uVar2;
  ListElementCount LVar3;
  PointerReader other;
  StructReader other_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  long lVar9;
  byte bVar10;
  word *pwVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  word *pwVar15;
  uint uVar16;
  ulong uVar17;
  uint i_1;
  uint amount;
  ElementCount index;
  uint i_2;
  uint uVar18;
  ListReader *__begin3;
  bool bVar19;
  AllocateResult AVar20;
  OrphanBuilder *result;
  ListReader *__end3;
  Fault f;
  SegmentBuilder *local_e8;
  StructBuilder local_c0;
  word *local_98;
  ulong local_90;
  SegmentReader *local_88;
  CapTableReader *pCStack_80;
  byte *local_78;
  int iStack_70;
  undefined4 uStack_6c;
  StructReader local_60;
  
  if (lists.size_ == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25]>
              ((Fault *)&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xd5a,FAILED,"lists.size() > 0","\"Can\'t concat empty list \"",
               (char (*) [25])"Can\'t concat empty list ");
    kj::_::Debug::Fault::fatal((Fault *)&local_c0);
  }
  pLVar1 = lists.ptr + lists.size_;
  uVar14 = (ulong)(uint)structSize;
  uVar12 = (uint)structSize >> 0x10;
  lVar9 = 0;
  uVar18 = 0;
  while (uVar18 = uVar18 + *(int *)((long)&(lists.ptr)->elementCount + lVar9), uVar18 < 0x20000000)
  {
    if (((&(lists.ptr)->elementSize)[lVar9] != elementSize) &&
       (((&(lists.ptr)->elementSize)[lVar9] == BIT ||
        (bVar19 = elementSize == BIT, elementSize = INLINE_COMPOSITE, bVar19)))) goto LAB_0014f574;
    uVar17 = uVar14 & 0xffff;
    uVar14 = (ulong)*(uint *)((long)&(lists.ptr)->structDataSize + lVar9) + 0x3f >> 6;
    if (uVar14 <= uVar17) {
      uVar14 = uVar17;
    }
    uVar2 = *(ushort *)((long)&(lists.ptr)->structPointerCount + lVar9);
    if ((ushort)uVar12 <= uVar2) {
      uVar12 = (uint)uVar2;
    }
    lVar9 = lVar9 + 0x30;
    if (lists.size_ * 0x30 == lVar9) {
      __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
      __return_storage_ptr__->location = (word *)0x0;
      (__return_storage_ptr__->tag).content = 0;
      __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
      if (elementSize == INLINE_COMPOSITE) {
        local_90 = uVar14 & 0xffff;
        uVar16 = uVar12 + (int)local_90;
        uVar17 = (ulong)uVar16 * (ulong)uVar18;
        if (0x1ffffffe < uVar17) {
          WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&local_c0);
        }
        iVar13 = (int)uVar17;
        amount = iVar13 + 1;
        if (arena == (BuilderArena *)0x0) {
          if (*(int *)((long)&(__return_storage_ptr__->tag).content + 4) != 0 ||
              (int)(__return_storage_ptr__->tag).content != 0) {
            WireHelpers::zeroObject
                      ((SegmentBuilder *)0x0,capTable,(WirePointer *)__return_storage_ptr__);
          }
          iVar8 = ((uint)(_DAT_00000028 - (long)__return_storage_ptr__ >> 1) & 0xfffffffc) - 3;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = _DAT_00000028;
          AVar20 = (AllocateResult)(auVar5 << 0x40);
          _DAT_00000028 = _DAT_00000028 + (ulong)amount * 8;
        }
        else {
          AVar20 = BuilderArena::allocate(arena,amount);
          iVar8 = -3;
        }
        local_98 = AVar20.words;
        local_e8 = AVar20.segment;
        *(int *)&(__return_storage_ptr__->tag).content = iVar8;
        *(int *)((long)&(__return_storage_ptr__->tag).content + 4) = iVar13 * 8 + 7;
        *(uint *)&local_98->content = uVar18 * 4;
        *(short *)((long)&local_98->content + 4) = (short)uVar14;
        *(StructPointerCount *)((long)&local_98->content + 6) = (StructPointerCount)uVar12;
        local_98 = local_98 + 1;
        iVar8 = (int)local_90;
        iVar13 = 0;
        do {
          LVar3 = (lists.ptr)->elementCount;
          if (LVar3 != 0) {
            index = 0;
            do {
              local_c0.data =
                   (void *)((long)&local_98->content +
                           ((ulong)(iVar13 + index) * (ulong)(uVar16 * 0x40) >> 3));
              local_c0.segment = local_e8;
              local_c0.pointers = (WirePointer *)((long)local_c0.data + (ulong)(uint)(iVar8 << 3));
              local_c0.capTable = capTable;
              local_c0.dataSize = iVar8 << 6;
              local_c0.pointerCount = (StructPointerCount)uVar12;
              ListReader::getStructElement(&local_60,lists.ptr,index);
              other_00.capTable = local_60.capTable;
              other_00.segment = local_60.segment;
              other_00.data = local_60.data;
              other_00.pointers = local_60.pointers;
              other_00.dataSize = local_60.dataSize;
              other_00.pointerCount = local_60.pointerCount;
              other_00._38_2_ = local_60._38_2_;
              other_00.nestingLimit = local_60.nestingLimit;
              other_00._44_4_ = local_60._44_4_;
              StructBuilder::copyContentFrom(&local_c0,other_00);
              index = index + 1;
            } while (LVar3 != index);
            iVar13 = iVar13 + index;
          }
          AVar20.words = local_98;
          AVar20.segment = local_e8;
          lists.ptr = lists.ptr + 1;
        } while (lists.ptr != pLVar1);
      }
      else {
        uVar12 = *(uint *)(BITS_PER_ELEMENT_INCLUDING_PONITERS_TABLE + (ulong)elementSize * 4);
        uVar14 = (ulong)uVar18 * (ulong)uVar12 + 0x3f >> 6;
        if (arena == (BuilderArena *)0x0) {
          iVar13 = ((uint)(_DAT_00000028 - (long)__return_storage_ptr__ >> 1) & 0xfffffffc) - 3;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = _DAT_00000028;
          AVar20 = (AllocateResult)(auVar4 << 0x40);
          _DAT_00000028 = _DAT_00000028 + (uVar14 & 0xffffffff) * 8;
        }
        else {
          AVar20 = BuilderArena::allocate(arena,(SegmentWordCount)uVar14);
          iVar13 = -3;
        }
        pwVar11 = AVar20.words;
        local_e8 = AVar20.segment;
        *(int *)&(__return_storage_ptr__->tag).content = iVar13;
        *(uint *)((long)&(__return_storage_ptr__->tag).content + 4) = uVar18 * 8 | (uint)elementSize
        ;
        if (elementSize == POINTER) {
          iVar13 = 0;
          do {
            uVar18 = (lists.ptr)->elementCount;
            if ((ulong)uVar18 != 0) {
              uVar14 = 0;
              do {
                local_c0.data =
                     (void *)((long)&pwVar11->content +
                             ((ulong)(uint)((int)uVar14 + iVar13) * (ulong)uVar12 >> 3));
                local_c0.segment = local_e8;
                local_78 = (lists.ptr)->ptr + ((lists.ptr)->step * uVar14 >> 3);
                iStack_70 = (lists.ptr)->nestingLimit;
                local_88 = (lists.ptr)->segment;
                pCStack_80 = (lists.ptr)->capTable;
                uVar6 = (lists.ptr)->segment;
                uVar7 = (lists.ptr)->capTable;
                other.capTable = (CapTableReader *)uVar7;
                other.segment = (SegmentReader *)uVar6;
                other._28_4_ = uStack_6c;
                other.nestingLimit = iStack_70;
                other.pointer = (WirePointer *)local_78;
                local_c0.capTable = capTable;
                PointerBuilder::copyFrom((PointerBuilder *)&local_c0,other,false);
                uVar14 = uVar14 + 1;
              } while (uVar18 != uVar14);
              iVar13 = iVar13 + (int)uVar14;
            }
            lists.ptr = lists.ptr + 1;
          } while (lists.ptr != pLVar1);
        }
        else if (elementSize == 1) {
          iVar13 = 0;
          do {
            uVar12 = (lists.ptr)->elementCount;
            if (uVar12 != 0) {
              uVar14 = 0;
              do {
                uVar18 = (uint)uVar14;
                uVar17 = (ulong)(iVar13 + uVar18 >> 3);
                bVar10 = (byte)(iVar13 + uVar18) & 7;
                *(byte *)((long)&pwVar11->content + uVar17) =
                     (((lists.ptr)->ptr[uVar14 >> 3] >> (uVar18 & 7) & 1) != 0) << bVar10 |
                     *(byte *)((long)&pwVar11->content + uVar17) & ~(byte)(1 << bVar10);
                uVar18 = uVar18 + 1;
                uVar14 = (ulong)uVar18;
              } while (uVar12 != uVar18);
              iVar13 = iVar13 + uVar18;
            }
            lists.ptr = lists.ptr + 1;
          } while (lists.ptr != pLVar1);
        }
        else {
          lVar9 = 0;
          do {
            uVar17 = (ulong)*(uint *)((long)&(lists.ptr)->elementCount + lVar9) *
                     (ulong)(uVar12 >> 3);
            uVar14 = uVar17 & 0xffffffff;
            if (uVar14 != 0) {
              memcpy(pwVar11,*(void **)((long)&(lists.ptr)->ptr + lVar9),uVar14);
            }
            pwVar11 = (word *)((long)&pwVar11->content + uVar17);
            lVar9 = lVar9 + 0x30;
          } while (lists.size_ * 0x30 != lVar9);
        }
      }
      pwVar15 = AVar20.words;
      local_e8 = AVar20.segment;
      pwVar11 = pwVar15 + -1;
      if (pwVar15 == (word *)0x0) {
        pwVar11 = pwVar15;
      }
      __return_storage_ptr__->segment = local_e8;
      __return_storage_ptr__->capTable = capTable;
      if (elementSize != INLINE_COMPOSITE) {
        pwVar11 = pwVar15;
      }
      __return_storage_ptr__->location = pwVar11;
      return __return_storage_ptr__;
    }
  }
  concat::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)__return_storage_ptr__);
LAB_0014f574:
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
            ((Fault *)&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xd64,FAILED,"list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT"
             ,"\"can\'t upgrade bit lists to struct lists\"",
             (char (*) [40])"can\'t upgrade bit lists to struct lists");
  kj::_::Debug::Fault::fatal((Fault *)&local_c0);
}

Assistant:

OrphanBuilder OrphanBuilder::concat(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementSize elementSize, StructSize structSize,
    kj::ArrayPtr<const ListReader> lists) {
  KJ_REQUIRE(lists.size() > 0, "Can't concat empty list ");

  // Find the overall element count and size.
  ListElementCount elementCount = ZERO * ELEMENTS;
  for (auto& list: lists) {
    elementCount = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(elementCount + list.elementCount,
        []() { KJ_FAIL_REQUIRE("concatenated list exceeds list size limit"); });
    if (list.elementSize != elementSize) {
      // If element sizes don't all match, upgrade to struct list.
      KJ_REQUIRE(list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT,
                 "can't upgrade bit lists to struct lists");
      elementSize = ElementSize::INLINE_COMPOSITE;
    }
    structSize.data = kj::max(structSize.data,
        WireHelpers::roundBitsUpToWords(list.structDataSize));
    structSize.pointers = kj::max(structSize.pointers, list.structPointerCount);
  }

  // Allocate the list.
  OrphanBuilder result;
  ListBuilder builder = (elementSize == ElementSize::INLINE_COMPOSITE)
      ? WireHelpers::initStructListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, structSize, arena)
      : WireHelpers::initListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);

  // Copy elements.
  switch (elementSize) {
    case ElementSize::INLINE_COMPOSITE: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getStructElement(pos).copyContentFrom(list.getStructElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::POINTER: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getPointerElement(pos).copyFrom(list.getPointerElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::BIT: {
      // It's difficult to memcpy() bits since a list could start or end mid-byte. For now we
      // do a slow, naive loop. Probably no one will ever care.
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.setDataElement<bool>(pos, list.getDataElement<bool>(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    default: {
      // We know all the inputs are primitives with identical size because otherwise we would have
      // chosen INLINE_COMPOSITE. Therefore, we can safely use memcpy() here instead of copying
      // each element manually.
      byte* target = builder.ptr;
      auto step = builder.step / BITS_PER_BYTE;
      for (auto& list: lists) {
        auto count = step * upgradeBound<uint64_t>(list.size());
        WireHelpers::copyMemory(target, list.ptr, assumeBits<SEGMENT_WORD_COUNT_BITS>(count));
        target += count;
      }
      break;
    }
  }

  // Return orphan.
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}